

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O3

void transassn(quadtype nextquad)

{
  char source [10];
  char target [10];
  char local_2c [10];
  char local_22 [10];
  
  getlabel(source._4_4_,local_22);
  getlabel(target._2_4_,local_2c);
  fwrite("; ",2,1,(FILE *)ofp);
  fprintlexeme(ofp,source._4_4_);
  fwrite(" := ",4,1,(FILE *)ofp);
  fprintlexeme(ofp,target._2_4_);
  fputc(10,(FILE *)ofp);
  emitfromone(opcmov,"ax",target._2_4_);
  emittoone(opcmov,source._4_4_,"ax");
  return;
}

Assistant:

void    transassn(struct quadtype nextquad)
{
    char    target[LABELSIZE], source[LABELSIZE];
    getlabel(nextquad.op1.opnd, target);
    getlabel(nextquad.op2.opnd, source);
    fprintf(ofp, "; ");
    fprintlexeme(ofp, nextquad.op1.opnd);
    fprintf(ofp, " := ");
    fprintlexeme(ofp, nextquad.op2.opnd);
    fprintf(ofp, "\n");
    
    emitfromone(opcmov, "ax", nextquad.op2.opnd);
    emittoone(opcmov, nextquad.op1.opnd, "ax");
    
    
}